

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_decoder.cpp
# Opt level: O0

void __thiscall
duckdb::DictionaryDecoder::InitializeDictionary
          (DictionaryDecoder *this,idx_t new_dictionary_size,
          optional_ptr<const_duckdb::TableFilter,_true> filter,
          optional_ptr<duckdb::TableFilterState,_true> filter_state,bool has_defines)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  type pVVar5;
  pointer pVVar6;
  TableFilter *pTVar7;
  TableFilterState *pTVar8;
  type pbVar9;
  long in_RSI;
  long *in_RDI;
  byte in_R8B;
  idx_t idx;
  idx_t i;
  SelectionVector dict_sel;
  UnifiedVectorFormat vdata;
  ValidityMask *dict_validity;
  idx_t old_dict_size;
  TableFilterState *in_stack_fffffffffffffe18;
  ulong *__i;
  TableFilter *in_stack_fffffffffffffe20;
  DictionaryDecoder *in_stack_fffffffffffffe28;
  size_t in_stack_fffffffffffffe38;
  char *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  ulong local_168;
  SelectionVector local_160;
  UnifiedVectorFormat local_148 [80];
  ValidityMask *local_f8;
  string local_f0 [48];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  long local_40;
  ulong local_30;
  byte local_21;
  optional_ptr local_8 [8];
  
  local_21 = in_R8B & 1;
  local_30 = in_RDI[9];
  in_RDI[9] = in_RSI;
  std::unique_ptr<bool[],_std::default_delete<bool[]>_>::reset
            ((unique_ptr<bool[],_std::default_delete<bool[]>_> *)in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18);
  in_RDI[0xc] = 0;
  *(byte *)(in_RDI + 0xd) = local_21 & 1;
  bVar4 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)0x84fce7);
  if (bVar4) {
    if (local_30 < (ulong)in_RDI[9]) {
      pVVar6 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                         ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                          in_stack_fffffffffffffe20);
      duckdb::Vector::Resize((ulong)pVVar6,local_30);
    }
  }
  else {
    ColumnReader::Type((ColumnReader *)*in_RDI);
    local_40 = in_RDI[9] + 1;
    make_uniq<duckdb::Vector,duckdb::LogicalType_const&,unsigned_long>
              ((LogicalType *)in_stack_fffffffffffffe58,(unsigned_long *)in_stack_fffffffffffffe50);
    unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator=
              ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
               in_stack_fffffffffffffe20,
               (unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
               in_stack_fffffffffffffe18);
    unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::~unique_ptr
              ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)0x84fd48);
  }
  BaseFileReader::GetFileName_abi_cxx11_(*(BaseFileReader **)(*in_RDI + 0x10));
  std::operator+(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  ColumnReader::Schema((ColumnReader *)*in_RDI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe28,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe20);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20);
  std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffe58);
  std::operator+(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  std::__cxx11::string::operator=((string *)(in_RDI + 0xe),local_60);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_c0);
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
            ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
             in_stack_fffffffffffffe20);
  local_f8 = FlatVector::Validity((Vector *)0x84feab);
  TemplatedValidityMask<unsigned_long>::Reset
            ((TemplatedValidityMask<unsigned_long> *)in_stack_fffffffffffffe20,
             (idx_t)in_stack_fffffffffffffe18);
  if ((*(byte *)(in_RDI + 0xd) & 1) != 0) {
    TemplatedValidityMask<unsigned_long>::SetInvalid
              ((TemplatedValidityMask<unsigned_long> *)in_stack_fffffffffffffe20,
               (idx_t)in_stack_fffffffffffffe18);
  }
  plVar1 = (long *)*in_RDI;
  lVar2 = *in_RDI;
  lVar3 = in_RDI[9];
  pVVar5 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                     ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                      in_stack_fffffffffffffe20);
  (**(code **)(*plVar1 + 0x78))(plVar1,lVar2 + 0x50,0,lVar3,0,pVVar5);
  bVar4 = duckdb::optional_ptr::operator_cast_to_bool(local_8);
  if (bVar4) {
    optional_ptr<const_duckdb::TableFilter,_true>::operator*
              ((optional_ptr<const_duckdb::TableFilter,_true> *)in_stack_fffffffffffffe20);
    optional_ptr<duckdb::TableFilterState,_true>::operator*
              ((optional_ptr<duckdb::TableFilterState,_true> *)in_stack_fffffffffffffe20);
    bVar4 = CanFilter(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18)
    ;
    if (bVar4) {
      make_unsafe_uniq_array<bool>(in_stack_fffffffffffffe38);
      unique_ptr<bool[],_std::default_delete<bool>,_false>::operator=
                ((unique_ptr<bool[],_std::default_delete<bool>,_false> *)in_stack_fffffffffffffe20,
                 (unique_ptr<bool[],_std::default_delete<bool>,_false> *)in_stack_fffffffffffffe18);
      unique_ptr<bool[],_std::default_delete<bool>,_false>::~unique_ptr
                ((unique_ptr<bool[],_std::default_delete<bool>,_false> *)0x85005c);
      duckdb::UnifiedVectorFormat::UnifiedVectorFormat(local_148);
      pVVar6 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                         ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                          in_stack_fffffffffffffe20);
      duckdb::Vector::ToUnifiedFormat((ulong)pVVar6,(UnifiedVectorFormat *)in_RDI[9]);
      SelectionVector::SelectionVector((SelectionVector *)0x8500a8);
      in_RDI[0xc] = in_RDI[9];
      pVVar5 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                          in_stack_fffffffffffffe20);
      pTVar7 = optional_ptr<const_duckdb::TableFilter,_true>::operator*
                         ((optional_ptr<const_duckdb::TableFilter,_true> *)in_stack_fffffffffffffe20
                         );
      pTVar8 = optional_ptr<duckdb::TableFilterState,_true>::operator*
                         ((optional_ptr<duckdb::TableFilterState,_true> *)in_stack_fffffffffffffe20)
      ;
      __i = (ulong *)(in_RDI + 0xc);
      duckdb::ColumnSegment::FilterSelection
                (&local_160,pVVar5,local_148,pTVar7,pTVar8,in_RDI[9],__i);
      for (local_168 = 0; local_168 < (ulong)in_RDI[0xc]; local_168 = local_168 + 1) {
        SelectionVector::get_index(&local_160,local_168);
        pbVar9 = unique_ptr<bool[],_std::default_delete<bool>,_false>::operator[]
                           ((unique_ptr<bool[],_std::default_delete<bool>,_false> *)
                            in_stack_fffffffffffffe20,(size_t)__i);
        *pbVar9 = true;
      }
      SelectionVector::~SelectionVector((SelectionVector *)0x8501ef);
      UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffe20);
    }
  }
  return;
}

Assistant:

void DictionaryDecoder::InitializeDictionary(idx_t new_dictionary_size, optional_ptr<const TableFilter> filter,
                                             optional_ptr<TableFilterState> filter_state, bool has_defines) {
	auto old_dict_size = dictionary_size;
	dictionary_size = new_dictionary_size;
	filter_result.reset();
	filter_count = 0;
	can_have_nulls = has_defines;
	// we use the first value in the dictionary to keep a NULL
	if (!dictionary) {
		dictionary = make_uniq<Vector>(reader.Type(), dictionary_size + 1);
	} else if (dictionary_size > old_dict_size) {
		dictionary->Resize(old_dict_size, dictionary_size + 1);
	}
	dictionary_id =
	    reader.reader.GetFileName() + "_" + reader.Schema().name + "_" + std::to_string(reader.chunk_read_offset);
	// we use the last entry as a NULL, dictionary vectors don't have a separate validity mask
	auto &dict_validity = FlatVector::Validity(*dictionary);
	dict_validity.Reset(dictionary_size + 1);
	if (can_have_nulls) {
		dict_validity.SetInvalid(dictionary_size);
	}
	reader.Plain(reader.block, nullptr, dictionary_size, 0, *dictionary);

	if (filter && CanFilter(*filter, *filter_state)) {
		// no filter result yet - apply filter to the dictionary
		// initialize the filter result - setting everything to false
		filter_result = make_unsafe_uniq_array<bool>(dictionary_size);

		// apply the filter
		UnifiedVectorFormat vdata;
		dictionary->ToUnifiedFormat(dictionary_size, vdata);
		SelectionVector dict_sel;
		filter_count = dictionary_size;
		ColumnSegment::FilterSelection(dict_sel, *dictionary, vdata, *filter, *filter_state, dictionary_size,
		                               filter_count);

		// now set all matching tuples to true
		for (idx_t i = 0; i < filter_count; i++) {
			auto idx = dict_sel.get_index(i);
			filter_result[idx] = true;
		}
	}
}